

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

bool __thiscall FIX::SessionState::retrieve(SessionState *this,int msgSeqNum,Message *message)

{
  iterator __position;
  _Rb_tree_header *p_Var1;
  key_type local_34;
  
  Mutex::lock(&this->m_mutex);
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_FIX::Message>,_std::_Select1st<std::pair<const_int,_FIX::Message>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::Message>_>_>
               ::find(&(this->m_queue)._M_t,&local_34);
  p_Var1 = &(this->m_queue)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    Message::operator=(message,(Message *)&__position._M_node[1]._M_parent);
    std::
    _Rb_tree<int,std::pair<int_const,FIX::Message>,std::_Select1st<std::pair<int_const,FIX::Message>>,std::less<int>,std::allocator<std::pair<int_const,FIX::Message>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,FIX::Message>,std::_Select1st<std::pair<int_const,FIX::Message>>,std::less<int>,std::allocator<std::pair<int_const,FIX::Message>>>
                        *)&this->m_queue,__position);
  }
  Mutex::unlock(&this->m_mutex);
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

bool retrieve( int msgSeqNum, Message& message )
  {
    Locker l( m_mutex );
    Messages::iterator i = m_queue.find( msgSeqNum );
    if ( i != m_queue.end() )
    {
      message = i->second;
      m_queue.erase( i );
      return true;
    }
    return false;
  }